

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int fmt::v6::internal::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  buffer<char> *pbVar10;
  int iVar11;
  result rVar12;
  int iVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  byte bVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  char cVar21;
  ulong uVar22;
  uint uVar23;
  uint64_t uVar24;
  size_t __len;
  uint64_t divisor;
  ulong uVar25;
  boundaries bVar26;
  fixed_handler handler;
  int local_84;
  ulong local_80;
  ulong local_78;
  double local_70;
  buffer<char> *local_68;
  fp local_60;
  ulong local_50;
  fixed_handler local_48;
  
  uVar15 = (ulong)(uint)precision;
  uVar20 = (ulong)specs & 0xff00000000;
  if (value <= 0.0) {
    if (0 < precision && uVar20 == 0x200000000) {
      if (buf->capacity_ < uVar15) {
        (**buf->_vptr_buffer)(buf,uVar15);
      }
      buf->size_ = uVar15;
      memset(buf->ptr_,0x30,uVar15);
      return -precision;
    }
    sVar14 = buf->size_;
    uVar15 = sVar14 + 1;
    if (buf->capacity_ < uVar15) {
      (**buf->_vptr_buffer)(buf);
      sVar14 = buf->size_;
      uVar15 = sVar14 + 1;
    }
    buf->size_ = uVar15;
    buf->ptr_[sVar14] = '0';
    return 0;
  }
  if ((specs._4_4_ >> 0x14 & 1) == 0) {
    iVar11 = snprintf_float<double>(value,precision,specs,buf);
    return iVar11;
  }
  local_84 = 0;
  if (precision == -1) {
    local_60.f = 0;
    local_60.e = 0;
    if ((specs._4_4_ >> 0x13 & 1) == 0) {
      local_70 = value;
      bVar26 = fp::assign_with_boundaries<double>(&local_60,value);
    }
    else {
      local_70 = value;
      bVar26 = fp::assign_float_with_boundaries<double>(&local_60,value);
    }
    if ((local_60.f & 0x10000000000000) == 0) {
      lVar19 = 0x3f;
      if ((local_60.f & 0xfffffffffffff) != 0) {
        for (; (local_60.f & 0xfffffffffffff) >> lVar19 == 0; lVar19 = lVar19 + -1) {
        }
      }
      local_60.f = local_60.f << (~(byte)lVar19 + 0x35 & 0x3f);
      local_60.e = (local_60.e - ((uint)lVar19 ^ 0x3f)) + 0xb;
    }
    iVar11 = (int)((ulong)((long)(-0x32 - local_60.e) * 0x4d104d42 + 0xffffffff) >> 0x20);
    uVar18 = iVar11 + 0x15b;
    uVar23 = iVar11 + 0x162;
    if (-1 < (int)uVar18) {
      uVar23 = uVar18;
    }
    local_78 = (ulong)((uVar23 & 0xfffffff8) + 8);
    uVar15 = *(ulong *)(basic_data<void>::pow10_significands + (long)((int)uVar23 >> 3) * 8 + 8);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar15;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_60.f << 0xb;
    local_60.f = SUB168(auVar2 * auVar6,8) - (SUB168(auVar2 * auVar6,0) >> 0x3f);
    cVar21 = (char)local_60.e;
    local_60.e = local_60.e +
                 *(short *)(basic_data<void>::pow10_exponents + (long)((int)uVar23 >> 3) * 2 + 2) +
                 0x35;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar15;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = bVar26.lower;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar15;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = bVar26.upper;
    lVar16 = SUB168(auVar4 * auVar8,8);
    lVar19 = -(SUB168(auVar4 * auVar8,0) >> 0x3f);
    uVar15 = lVar16 + lVar19 + 1;
    local_48.buf = buf->ptr_;
    local_48.size = 0;
    local_48._16_8_ = uVar15 - local_60.f;
    bVar17 = -(cVar21 + (char)*(short *)(basic_data<void>::pow10_exponents +
                                        (long)((int)uVar23 >> 3) * 2 + 2)) - 0x35;
    divisor = 1L << (bVar17 & 0x3f);
    uVar24 = ((SUB168(auVar3 * auVar7,0) >> 0x3f) - SUB168(auVar3 * auVar7,8)) + lVar16 + lVar19 + 2
    ;
    local_80 = divisor - 1;
    uVar20 = local_80 & uVar15;
    uVar15 = uVar15 >> (bVar17 & 0x3f);
    uVar18 = (uint)uVar15 | 1;
    uVar23 = 0x1f;
    if (uVar18 != 0) {
      for (; uVar18 >> uVar23 == 0; uVar23 = uVar23 - 1) {
      }
    }
    uVar23 = (uVar23 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
    local_84 = (uVar23 + 1) -
               (uint)((uint)uVar15 <
                     *(uint *)(basic_data<void>::zero_or_powers_of_10_32 + (ulong)uVar23 * 4));
    local_68 = buf;
    do {
      iVar11 = local_84 + -1;
      switch(iVar11) {
      case 0:
        cVar21 = (char)uVar15;
        uVar15 = 0;
        goto LAB_001771af;
      case 1:
        cVar21 = (char)((uVar15 & 0xffffffff) / 10);
        iVar13 = (int)((uVar15 & 0xffffffff) / 10) * 10;
        break;
      case 2:
        cVar21 = (char)((uVar15 & 0xffffffff) / 100);
        iVar13 = (int)((uVar15 & 0xffffffff) / 100) * 100;
        break;
      case 3:
        cVar21 = (char)((uVar15 & 0xffffffff) / 1000);
        iVar13 = (int)((uVar15 & 0xffffffff) / 1000) * 1000;
        break;
      case 4:
        cVar21 = (char)((uVar15 & 0xffffffff) / 10000);
        iVar13 = (int)((uVar15 & 0xffffffff) / 10000) * 10000;
        break;
      case 5:
        uVar25 = uVar15 >> 5 & 0x7ffffff;
        cVar21 = (char)(uVar25 / 0xc35);
        iVar13 = (int)(uVar25 / 0xc35) * 100000;
        break;
      case 6:
        cVar21 = (char)((uVar15 & 0xffffffff) / 1000000);
        iVar13 = (int)((uVar15 & 0xffffffff) / 1000000) * 1000000;
        break;
      case 7:
        cVar21 = (char)((uVar15 & 0xffffffff) / 10000000);
        iVar13 = (int)((uVar15 & 0xffffffff) / 10000000) * 10000000;
        break;
      case 8:
        cVar21 = (char)((uVar15 & 0xffffffff) / 100000000);
        iVar13 = (int)((uVar15 & 0xffffffff) / 100000000) * 100000000;
        break;
      case 9:
        uVar25 = (uVar15 >> 9 & 0x7fffff) * 0x44b83;
        cVar21 = (char)(uVar25 >> 0x27);
        iVar13 = (uint)(uVar25 >> 0x27) * 1000000000;
        break;
      default:
        cVar21 = '\0';
        goto LAB_001771af;
      }
      uVar15 = (ulong)(uint)((int)uVar15 - iVar13);
LAB_001771af:
      lVar19 = (long)local_84;
      local_84 = iVar11;
      rVar12 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&local_48,cVar21 + '0',
                          *(long *)("N3fmt2v612format_errorE" + lVar19 * 8 + 0x10) <<
                          (bVar17 & 0x3f),((uVar15 & 0xffffffff) << (bVar17 & 0x3f)) + uVar20,uVar24
                          ,iVar11,true);
      uVar25 = local_80;
      if (rVar12 != more) goto LAB_00177256;
    } while (0 < local_84);
    do {
      uVar15 = uVar20 * 10;
      uVar24 = uVar24 * 10;
      uVar20 = uVar15 & uVar25;
      local_84 = local_84 + -1;
      rVar12 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&local_48,
                          (char)(uVar15 >> (bVar17 & 0x3f)) + '0',divisor,uVar20,uVar24,local_84,
                          false);
    } while (rVar12 == more);
LAB_00177256:
    pbVar10 = local_68;
    uVar15 = (ulong)(uint)local_48.size;
    if (rVar12 == error) {
      local_84 = local_84 + (local_48.size - (int)local_78) + 0x15b;
      fallback_format<double>(local_70,local_68,&local_84);
      return local_84;
    }
    if (local_68->capacity_ < uVar15) {
      (**local_68->_vptr_buffer)(local_68,uVar15);
    }
    pbVar10->size_ = uVar15;
    iVar11 = (int)local_78;
LAB_0017764c:
    iVar11 = (local_84 - iVar11) + 0x15c;
  }
  else {
    if (precision < 0x12) {
      uVar15 = (ulong)value & 0xfffffffffffff;
      uVar23 = (uint)((ulong)value >> 0x34) & 0x7ff;
      if (uVar23 == 0) {
        lVar19 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar19 == 0; lVar19 = lVar19 + -1) {
          }
        }
        lVar16 = uVar15 << (~(byte)lVar19 + 0x35 & 0x3f);
        iVar11 = ((uint)lVar19 ^ 0xffffffc0) - 0x426;
      }
      else {
        iVar11 = uVar23 - 0x433;
        lVar16 = uVar15 + 0x10000000000000;
      }
      iVar13 = (int)((ulong)((long)(-0x32 - iVar11) * 0x4d104d42 + 0xffffffff) >> 0x20);
      uVar18 = iVar13 + 0x15b;
      uVar23 = iVar13 + 0x162;
      if (-1 < (int)uVar18) {
        uVar23 = uVar18;
      }
      local_78 = (ulong)(uVar23 & 0xfffffff8);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = lVar16 << 0xb;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(basic_data<void>::pow10_significands +
                               (long)((int)uVar23 >> 3) * 8 + 8);
      uVar25 = SUB168(auVar5 * auVar9,8) - (SUB168(auVar5 * auVar9,0) >> 0x3f);
      bVar17 = -((char)*(undefined2 *)
                        (basic_data<void>::pow10_exponents + (long)((int)uVar23 >> 3) * 2 + 2) +
                (char)iVar11) - 0x35;
      local_48.buf = buf->ptr_;
      local_48.size = 0;
      local_48.fixed = uVar20 == 0x200000000;
      local_48.exp10 = 0x154 - (uVar23 & 0xfffffff8);
      local_80 = 1L << (bVar17 & 0x3f);
      uVar15 = uVar25 >> (bVar17 & 0x3f);
      uVar18 = (uint)uVar15 | 1;
      uVar23 = 0x1f;
      if (uVar18 != 0) {
        for (; uVar18 >> uVar23 == 0; uVar23 = uVar23 - 1) {
        }
      }
      uVar23 = (uVar23 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
      iVar11 = uVar23 - ((uint)uVar15 <
                        *(uint *)(basic_data<void>::zero_or_powers_of_10_32 + (ulong)uVar23 * 4));
      local_84 = iVar11 + 1;
      local_70 = value;
      local_68 = buf;
      local_48.precision = precision;
      rVar12 = fixed_handler::on_start
                         (&local_48,(&basic_data<void>::powers_of_10_64)[iVar11] << (bVar17 & 0x3f),
                          uVar25 / 10,10,&local_84);
      if (rVar12 == more) {
        local_50 = local_80 - 1;
        uVar25 = uVar25 & local_50;
        do {
          iVar11 = local_84 + -1;
          switch(iVar11) {
          case 0:
            cVar21 = (char)uVar15;
            uVar15 = 0;
            goto LAB_00177513;
          case 1:
            cVar21 = (char)((uVar15 & 0xffffffff) / 10);
            iVar13 = (int)((uVar15 & 0xffffffff) / 10) * 10;
            break;
          case 2:
            cVar21 = (char)((uVar15 & 0xffffffff) / 100);
            iVar13 = (int)((uVar15 & 0xffffffff) / 100) * 100;
            break;
          case 3:
            cVar21 = (char)((uVar15 & 0xffffffff) / 1000);
            iVar13 = (int)((uVar15 & 0xffffffff) / 1000) * 1000;
            break;
          case 4:
            cVar21 = (char)((uVar15 & 0xffffffff) / 10000);
            iVar13 = (int)((uVar15 & 0xffffffff) / 10000) * 10000;
            break;
          case 5:
            uVar22 = uVar15 >> 5 & 0x7ffffff;
            cVar21 = (char)(uVar22 / 0xc35);
            iVar13 = (int)(uVar22 / 0xc35) * 100000;
            break;
          case 6:
            cVar21 = (char)((uVar15 & 0xffffffff) / 1000000);
            iVar13 = (int)((uVar15 & 0xffffffff) / 1000000) * 1000000;
            break;
          case 7:
            cVar21 = (char)((uVar15 & 0xffffffff) / 10000000);
            iVar13 = (int)((uVar15 & 0xffffffff) / 10000000) * 10000000;
            break;
          case 8:
            cVar21 = (char)((uVar15 & 0xffffffff) / 100000000);
            iVar13 = (int)((uVar15 & 0xffffffff) / 100000000) * 100000000;
            break;
          case 9:
            uVar22 = (uVar15 >> 9 & 0x7fffff) * 0x44b83;
            cVar21 = (char)(uVar22 >> 0x27);
            iVar13 = (uint)(uVar22 >> 0x27) * 1000000000;
            break;
          default:
            cVar21 = '\0';
            goto LAB_00177513;
          }
          uVar15 = (ulong)(uint)((int)uVar15 - iVar13);
LAB_00177513:
          lVar19 = (long)local_84;
          local_84 = iVar11;
          rVar12 = fixed_handler::on_digit
                             (&local_48,cVar21 + '0',
                              *(long *)("N3fmt2v612format_errorE" + lVar19 * 8 + 0x10) <<
                              (bVar17 & 0x3f),((uVar15 & 0xffffffff) << (bVar17 & 0x3f)) + uVar25,1,
                              iVar11,true);
          if (rVar12 != more) goto LAB_001775c6;
        } while (0 < local_84);
        uVar24 = 1;
        do {
          uVar15 = uVar25 * 10;
          uVar24 = uVar24 * 10;
          uVar25 = uVar15 & local_50;
          local_84 = local_84 + -1;
          rVar12 = fixed_handler::on_digit
                             (&local_48,(char)(uVar15 >> (bVar17 & 0x3f)) + '0',local_80,uVar25,
                              uVar24,local_84,false);
        } while (rVar12 == more);
      }
LAB_001775c6:
      pbVar10 = local_68;
      buf = local_68;
      value = local_70;
      if (rVar12 != error) {
        uVar15 = (ulong)(uint)local_48.size;
        if (0 < local_48.size && uVar20 != 0x200000000) {
          uVar15 = (ulong)(uint)local_48.size;
          do {
            iVar11 = local_84 + 1;
            if (local_68->ptr_[uVar15 - 1] != '0') goto LAB_0017762c;
            bVar1 = 1 < uVar15;
            uVar15 = uVar15 - 1;
            local_84 = iVar11;
          } while (bVar1);
          uVar15 = 0;
        }
LAB_0017762c:
        uVar15 = uVar15 & 0xffffffff;
        if (local_68->capacity_ < uVar15) {
          (**local_68->_vptr_buffer)(local_68,uVar15);
        }
        iVar11 = (int)local_78 + 8;
        pbVar10->size_ = uVar15;
        goto LAB_0017764c;
      }
    }
    iVar11 = snprintf_float<double>(value,precision,specs,buf);
  }
  return iVar11;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>(), "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision != -1) {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  } else {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  }
  return exp - cached_exp10;
}